

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::SourceCodeInfo_Location::Clear(SourceCodeInfo_Location *this)

{
  RepeatedField<int> *pRVar1;
  ulong uVar2;
  anon_union_96_1_493b367e_for_SourceCodeInfo_Location_3 aVar3;
  int iVar4;
  undefined8 *puVar5;
  bool bVar6;
  LogMessageFatal local_30;
  
  pRVar1 = &(this->field_0)._impl_.path_;
  aVar3 = this->field_0;
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x4) != (undefined1  [96])0x0) {
    internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar6 = ((undefined1  [96])aVar3 & (undefined1  [96])0x4) == (undefined1  [96])0x0;
  internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  iVar4 = internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  RepeatedField<int>::set_size
            (pRVar1,((undefined1  [96])aVar3 & (undefined1  [96])0x4) == (undefined1  [96])0x0,0);
  pRVar1 = &(this->field_0)._impl_.span_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar2 & 4) != 0) {
    internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar6 = (uVar2 & 4) == 0;
  internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  iVar4 = internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.leading_detached_comments_.super_RepeatedPtrFieldBase);
  aVar3 = this->field_0;
  if (((undefined1  [96])aVar3 & (undefined1  [96])0x3) != (undefined1  [96])0x0) {
    if (((undefined1  [96])aVar3 & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
      uVar2 = *(ulong *)((long)&this->field_0 + 0x50);
      if ((uVar2 & 3) == 0) goto LAB_0026034a;
      puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      puVar5[1] = 0;
      *(undefined1 *)*puVar5 = 0;
    }
    if (((undefined1  [96])aVar3 & (undefined1  [96])0x2) != (undefined1  [96])0x0) {
      uVar2 = *(ulong *)((long)&this->field_0 + 0x58);
      if ((uVar2 & 3) == 0) {
LAB_0026034a:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
                   ,0x20b,"!tagged_ptr_.IsDefault()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
      }
      puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      puVar5[1] = 0;
      *(undefined1 *)*puVar5 = 0;
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void SourceCodeInfo_Location::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.SourceCodeInfo.Location)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.path_.Clear();
  _impl_.span_.Clear();
  _impl_.leading_detached_comments_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.leading_comments_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.trailing_comments_.ClearNonDefaultToEmpty();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}